

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O1

void test_insert_more(CuTest *tc)

{
  int iVar1;
  char *pcVar2;
  critbit_tree cb;
  critbit_tree local_38;
  
  local_38.root = (void *)0x0;
  iVar1 = cb_insert(&local_38,"herp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x2b,(char *)0x0,0,iVar1);
  iVar1 = cb_insert(&local_38,"derp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x2d,(char *)0x0,0,iVar1);
  iVar1 = cb_insert(&local_38,"murp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x2f,(char *)0x0,0,iVar1);
  pcVar2 = (char *)cb_find(&local_38,"herp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x32,(char *)0x0,"herp",pcVar2);
  pcVar2 = (char *)cb_find(&local_38,"derp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x34,(char *)0x0,"derp",pcVar2);
  pcVar2 = (char *)cb_find(&local_38,"murp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x36,(char *)0x0,"murp",pcVar2);
  cb_clear(&local_38);
  return;
}

Assistant:

static void test_insert_more(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result;
  const char * str;

  result = cb_insert_str(&cb, "herp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_insert_str(&cb, "derp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_insert_str(&cb, "murp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);

  str = cb_find_str(&cb, "herp");
  CuAssertStrEquals(tc, "herp", str);
  str = cb_find_str(&cb, "derp");
  CuAssertStrEquals(tc, "derp", str);
  str = cb_find_str(&cb, "murp");
  CuAssertStrEquals(tc, "murp", str);

  cb_clear(&cb);
}